

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

ChromeFrameReporter * __thiscall
perfetto::protos::gen::ChromeFrameReporter::operator=
          (ChromeFrameReporter *this,ChromeFrameReporter *param_1)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined3 uVar4;
  ChromeFrameReporter_FrameType CVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined4 uVar9;
  bool bVar10;
  ChromeFrameReporter_ScrollState CVar11;
  ChromeFrameReporter_State CVar12;
  ChromeFrameReporter_FrameDropReason CVar13;
  
  uVar4 = *(undefined3 *)&param_1->field_0x39;
  CVar5 = param_1->frame_type_;
  this->has_high_latency_ = param_1->has_high_latency_;
  *(undefined3 *)&this->field_0x39 = uVar4;
  this->frame_type_ = CVar5;
  CVar12 = param_1->state_;
  CVar13 = param_1->reason_;
  uVar1 = param_1->frame_source_;
  uVar2 = param_1->frame_sequence_;
  bVar10 = param_1->affects_smoothness_;
  uVar4 = *(undefined3 *)&param_1->field_0x21;
  CVar11 = param_1->scroll_state_;
  bVar6 = param_1->has_compositor_animation_;
  bVar7 = param_1->has_smooth_input_main_;
  bVar8 = param_1->has_missing_content_;
  uVar9 = *(undefined4 *)&param_1->field_0x2c;
  uVar3 = param_1->layer_tree_host_id_;
  this->has_main_animation_ = param_1->has_main_animation_;
  this->has_compositor_animation_ = bVar6;
  this->has_smooth_input_main_ = bVar7;
  this->has_missing_content_ = bVar8;
  *(undefined4 *)&this->field_0x2c = uVar9;
  this->layer_tree_host_id_ = uVar3;
  this->frame_sequence_ = uVar2;
  this->affects_smoothness_ = bVar10;
  *(undefined3 *)&this->field_0x21 = uVar4;
  this->scroll_state_ = CVar11;
  this->state_ = CVar12;
  this->reason_ = CVar13;
  this->frame_source_ = uVar1;
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool ChromeFrameReporter::operator==(const ChromeFrameReporter& other) const {
  return unknown_fields_ == other.unknown_fields_
   && state_ == other.state_
   && reason_ == other.reason_
   && frame_source_ == other.frame_source_
   && frame_sequence_ == other.frame_sequence_
   && affects_smoothness_ == other.affects_smoothness_
   && scroll_state_ == other.scroll_state_
   && has_main_animation_ == other.has_main_animation_
   && has_compositor_animation_ == other.has_compositor_animation_
   && has_smooth_input_main_ == other.has_smooth_input_main_
   && has_missing_content_ == other.has_missing_content_
   && layer_tree_host_id_ == other.layer_tree_host_id_
   && has_high_latency_ == other.has_high_latency_
   && frame_type_ == other.frame_type_;
}